

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O0

deBool qpTestLog_writeKeyValuePair
                 (qpTestLog *log,char *elementName,char *name,char *description,char *unit,
                 qpKeyValueTag tag,char *text)

{
  deBool dVar1;
  long lVar2;
  undefined1 local_1d0 [16];
  char *local_1c0;
  char *local_1b8;
  undefined1 local_1b0 [16];
  char *local_1a0;
  char *local_198;
  undefined1 local_190 [16];
  char *local_180;
  char *local_178;
  undefined1 local_170 [16];
  char *local_160;
  char *local_158;
  int local_14c;
  undefined1 local_148 [4];
  int numAttribs;
  qpXmlAttribute attribs [8];
  char *tagString;
  qpKeyValueTag tag_local;
  char *unit_local;
  char *description_local;
  char *name_local;
  char *elementName_local;
  qpTestLog *log_local;
  
  attribs[7]._24_8_ = qpLookupString(s_qpTagMap,6,tag);
  local_14c = 0;
  deMutex_lock(log->lock);
  if (name != (char *)0x0) {
    lVar2 = (long)local_14c;
    local_14c = local_14c + 1;
    qpSetStringAttrib((qpXmlAttribute *)local_170,"Name",name);
    *(undefined8 *)(local_148 + lVar2 * 0x20) = local_170._0_8_;
    attribs[lVar2].name = (char *)local_170._8_8_;
    *(char **)&attribs[lVar2].type = local_160;
    attribs[lVar2].stringValue = local_158;
  }
  if (description != (char *)0x0) {
    lVar2 = (long)local_14c;
    local_14c = local_14c + 1;
    qpSetStringAttrib((qpXmlAttribute *)local_190,"Description",description);
    *(undefined8 *)(local_148 + lVar2 * 0x20) = local_190._0_8_;
    attribs[lVar2].name = (char *)local_190._8_8_;
    *(char **)&attribs[lVar2].type = local_180;
    attribs[lVar2].stringValue = local_178;
  }
  if (attribs[7]._24_8_ != 0) {
    lVar2 = (long)local_14c;
    local_14c = local_14c + 1;
    qpSetStringAttrib((qpXmlAttribute *)local_1b0,"Tag",(char *)attribs[7]._24_8_);
    *(undefined8 *)(local_148 + lVar2 * 0x20) = local_1b0._0_8_;
    attribs[lVar2].name = (char *)local_1b0._8_8_;
    *(char **)&attribs[lVar2].type = local_1a0;
    attribs[lVar2].stringValue = local_198;
  }
  if (unit != (char *)0x0) {
    lVar2 = (long)local_14c;
    local_14c = local_14c + 1;
    qpSetStringAttrib((qpXmlAttribute *)local_1d0,"Unit",unit);
    *(undefined8 *)(local_148 + lVar2 * 0x20) = local_1d0._0_8_;
    attribs[lVar2].name = (char *)local_1d0._8_8_;
    *(char **)&attribs[lVar2].type = local_1c0;
    attribs[lVar2].stringValue = local_1b8;
  }
  dVar1 = qpXmlWriter_startElement(log->writer,elementName,local_14c,(qpXmlAttribute *)local_148);
  if (((dVar1 != 0) && (dVar1 = qpXmlWriter_writeString(log->writer,text), dVar1 != 0)) &&
     (dVar1 = qpXmlWriter_endElement(log->writer,elementName), dVar1 != 0)) {
    deMutex_unlock(log->lock);
    return 1;
  }
  qpPrintf("qpTestLog_writeKeyValuePair(): Writing XML failed\n");
  deMutex_unlock(log->lock);
  return 0;
}

Assistant:

static deBool qpTestLog_writeKeyValuePair (qpTestLog* log, const char* elementName, const char* name, const char* description, const char* unit, qpKeyValueTag tag, const char* text)
{
	const char*		tagString = QP_LOOKUP_STRING(s_qpTagMap, tag);
	qpXmlAttribute	attribs[8];
	int				numAttribs = 0;

	DE_ASSERT(log && elementName && text);
	deMutex_lock(log->lock);

	/* Fill in attributes. */
	if (name)			attribs[numAttribs++] = qpSetStringAttrib("Name", name);
	if (description)	attribs[numAttribs++] = qpSetStringAttrib("Description", description);
	if (tagString)		attribs[numAttribs++] = qpSetStringAttrib("Tag", tagString);
	if (unit)			attribs[numAttribs++] = qpSetStringAttrib("Unit", unit);

	if (!qpXmlWriter_startElement(log->writer, elementName, numAttribs, attribs) ||
		!qpXmlWriter_writeString(log->writer, text) ||
		!qpXmlWriter_endElement(log->writer, elementName))
	{
		qpPrintf("qpTestLog_writeKeyValuePair(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}